

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_compressed_data_out(png_structrp png_ptr,compression_state *comp)

{
  png_compression_buffer *ppVar1;
  uint uVar2;
  uint uVar3;
  png_compression_bufferp ppVar4;
  bool bVar5;
  
  uVar3 = comp->output_len;
  ppVar4 = png_ptr->zbuffer_list;
  uVar2 = 0x400;
  if (uVar3 < 0x400) {
    uVar2 = uVar3;
  }
  png_write_chunk_data(png_ptr,comp->output,(ulong)uVar2);
  uVar3 = uVar3 - uVar2;
  bVar5 = uVar3 == 0;
  if (ppVar4 != (png_compression_bufferp)0x0 && !bVar5) {
    do {
      ppVar1 = ppVar4->next;
      uVar2 = png_ptr->zbuffer_size;
      if (uVar3 <= png_ptr->zbuffer_size) {
        uVar2 = uVar3;
      }
      png_write_chunk_data(png_ptr,ppVar4->output,(ulong)uVar2);
      uVar3 = uVar3 - uVar2;
      bVar5 = uVar3 == 0;
    } while ((!bVar5) && (ppVar4 = ppVar1, ppVar1 != (png_compression_buffer *)0x0));
  }
  if (bVar5) {
    return;
  }
  png_error(png_ptr,"error writing ancillary chunked compressed data");
}

Assistant:

static void
png_write_compressed_data_out(png_structrp png_ptr, compression_state *comp)
{
   png_uint_32 output_len = comp->output_len;
   png_const_bytep output = comp->output;
   png_uint_32 avail = (sizeof comp->output);
   png_compression_buffer *next = png_ptr->zbuffer_list;

   for (;;)
   {
      if (avail > output_len)
         avail = output_len;

      png_write_chunk_data(png_ptr, output, avail);

      output_len -= avail;

      if (output_len == 0 || next == NULL)
         break;

      avail = png_ptr->zbuffer_size;
      output = next->output;
      next = next->next;
   }

   /* This is an internal error; 'next' must have been NULL! */
   if (output_len > 0)
      png_error(png_ptr, "error writing ancillary chunked compressed data");
}